

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCexMerge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  char *pcVar4;
  uint local_3c;
  int fVerbose;
  int iFrStop;
  int iFrStart;
  int c;
  Abc_Cex_t *pCexNew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 0;
  local_3c = 1000000000;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"FGvh");
      if (iVar2 == -1) {
        if (pAbc->pCex == (Abc_Cex_t *)0x0) {
          Abc_Print(1,"There is no current cex.\n");
          return 0;
        }
        if (pAbc->pCex2 == (Abc_Cex_t *)0x0) {
          Abc_Print(1,"There is no saved cex.\n");
          return 0;
        }
        if ((int)((local_3c - fVerbose) + pAbc->pCex->iPo) < pAbc->pCex->iFrame) {
          Abc_Print(1,"Current CEX does not allow to shorten the saved CEX.\n");
          return 0;
        }
        pAVar3 = Abc_CexMerge(pAbc->pCex2,pAbc->pCex,fVerbose,local_3c);
        if (pAVar3 == (Abc_Cex_t *)0x0) {
          Abc_Print(1,"Merging CEXes has failed.\n");
          return 0;
        }
        if (pAbc->pCex2 != (Abc_Cex_t *)0x0) {
          free(pAbc->pCex2);
          pAbc->pCex2 = (Abc_Cex_t *)0x0;
        }
        pAbc->pCex2 = pAVar3;
        return 0;
      }
      if (iVar2 == 0x46) break;
      if (iVar2 == 0x47) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
          goto LAB_0029af8f;
        }
        local_3c = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if ((int)local_3c < 0) goto LAB_0029af8f;
      }
      else {
        if (iVar2 == 0x68) goto LAB_0029af8f;
        if (iVar2 != 0x76) {
          Abc_Print(-2,"Unknown switch.\n");
          goto LAB_0029af8f;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      break;
    }
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < fVerbose);
LAB_0029af8f:
  Abc_Print(-2,"usage: cexmerge [-FG num] [-vh]\n");
  Abc_Print(-2,"\t         merges the current CEX into the saved one\n");
  Abc_Print(-2,"\t         and sets the resulting CEX as the saved one\n");
  Abc_Print(-2,"\t-F num : 0-based number of the starting frame [default = %d]\n",
            (ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-G num : 0-based number of the ending frame [default = %d]\n",(ulong)local_3c);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandCexMerge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Cex_t * pCexNew;
    int c;
    int iFrStart = 0;
    int iFrStop  = ABC_INFINITY;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStop < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }
    if ( pAbc->pCex2 == NULL )
    {
        Abc_Print( 1, "There is no saved cex.\n");
        return 0;
    }
    if ( iFrStop - iFrStart + pAbc->pCex->iPo < pAbc->pCex->iFrame )
    {
        Abc_Print( 1, "Current CEX does not allow to shorten the saved CEX.\n");
        return 0;
    }
    pCexNew = Abc_CexMerge( pAbc->pCex2, pAbc->pCex, iFrStart, iFrStop );
    if ( pCexNew == NULL )
    {
        Abc_Print( 1, "Merging CEXes has failed.\n");
        return 0;
    }
    // replace the saved CEX
    ABC_FREE( pAbc->pCex2 );
    pAbc->pCex2 = pCexNew;
    return 0;

usage:
    Abc_Print( -2, "usage: cexmerge [-FG num] [-vh]\n" );
    Abc_Print( -2, "\t         merges the current CEX into the saved one\n" );
    Abc_Print( -2, "\t         and sets the resulting CEX as the saved one\n" );
    Abc_Print( -2, "\t-F num : 0-based number of the starting frame [default = %d]\n", iFrStart );
    Abc_Print( -2, "\t-G num : 0-based number of the ending frame [default = %d]\n",   iFrStop );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}